

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O2

int snprintf_canframe(char *buf,size_t size,cu_t *cu,int sep)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  uint local_38;
  
  if (size == 0) {
    size = 0;
    goto LAB_00103076;
  }
  bVar1 = (cu->cc).__pad;
  bVar2 = (cu->fd).len;
  if ((char)bVar2 < '\0') {
    uVar3 = (cu->xl).len;
    uVar7 = (uint)uVar3;
    if (sep == 0) {
      uVar7 = 0;
    }
    if ((ulong)(uVar7 + (uint)uVar3 * 2 + 0x16) <= size - 1) {
      uVar9 = 0;
      uVar7 = sprintf(buf,"%02X%03X#%02X:%02X:%08X#",(ulong)((cu->cc).can_id >> 0x10 & 0xff),
                      (ulong)((cu->cc).can_id & 0x7ff),(ulong)bVar2,(ulong)bVar1,(cu->xl).af);
      size = (size_t)uVar7;
      while( true ) {
        lVar12 = (long)(int)size;
        if (uVar3 == uVar9) break;
        bVar1 = cu->field3[uVar9 + 0xc];
        buf[lVar12] = "0123456789ABCDEF"[bVar1 >> 4];
        buf[lVar12 + 1] = "0123456789ABCDEF"[bVar1 & 0xf];
        uVar8 = lVar12 + 2;
        uVar9 = uVar9 + 1;
        if (sep != 0 && uVar9 < uVar3) {
          buf[uVar8] = '.';
          uVar8 = (ulong)((int)size + 3);
        }
        size = uVar8 & 0xffffffff;
      }
      buf[lVar12] = '\0';
      goto LAB_00103076;
    }
  }
  else {
    uVar7 = 0x40;
    if (bVar1 == 0) {
      uVar7 = 8;
    }
    uVar11 = (uint)bVar2;
    if (bVar2 <= (byte)uVar7) {
      uVar7 = uVar11;
    }
    uVar6 = uVar7;
    if (sep == 0) {
      uVar6 = 0;
    }
    uVar4 = (cu->cc).can_id;
    if ((ulong)((uVar4 >> 0x1d & 2) + uVar6 + uVar7 * 2 + 0xc) <= size - 1) {
      if ((uVar4 >> 0x1d & 1) == 0) {
        uVar6 = 0x1fffffff;
        if (-1 < (int)uVar4) {
          uVar6 = 0x7ff;
        }
        iVar5 = (int)uVar4 >> 0x1f;
        iVar10 = iVar5 * -5 + 2;
        lVar12 = (ulong)(uint)-iVar5 * 5 + 3;
        local_38 = iVar5 * -5 + 4;
      }
      else {
        local_38 = 9;
        lVar12 = 8;
        iVar10 = 7;
        uVar6 = 0x3fffffff;
      }
      _put_id(buf,iVar10,uVar4 & uVar6);
      buf[lVar12] = '#';
      if (bVar1 == 0) {
        if ((cu->field3[3] & 0x40) == 0) {
          size = (size_t)local_38;
          goto LAB_00102ff1;
        }
        uVar9 = (ulong)local_38;
        buf[uVar9] = 'R';
        if (uVar11 == 0) {
          uVar8 = uVar9 + 1 & 0xffffffff;
          size = uVar8;
        }
        else {
          uVar8 = uVar9 | 2;
          buf[uVar9 + 1] = "0123456789ABCDEF"[(cu->fd).len & 0xf];
          size = uVar8;
          if ((7 < bVar2) && ((byte)((cu->cc).len8_dlc - 9) < 7)) {
            buf[uVar8] = '_';
            buf[uVar9 + 3] = "0123456789ABCDEF"[(cu->cc).len8_dlc & 0xf];
            uVar8 = (ulong)(local_38 + 4);
            size = uVar8;
          }
        }
      }
      else {
        uVar9 = (ulong)local_38;
        buf[uVar9] = '#';
        buf[uVar9 + 1] = "0123456789ABCDEF"[(cu->cc).__pad & 0xf];
        size = uVar9 | 2;
        if (uVar11 != 0 && sep != 0) {
          buf[size] = '.';
          size = (size_t)(local_38 + 3);
        }
LAB_00102ff1:
        uVar9 = 0;
        while( true ) {
          iVar10 = (int)size;
          lVar12 = (long)iVar10;
          if (uVar7 == uVar9) break;
          bVar2 = cu->field3[uVar9 + 8];
          uVar8 = lVar12 + 2;
          uVar9 = uVar9 + 1;
          buf[lVar12] = "0123456789ABCDEF"[bVar2 >> 4];
          buf[lVar12 + 1] = "0123456789ABCDEF"[bVar2 & 0xf];
          if ((sep != 0) && (uVar9 < uVar7)) {
            buf[uVar8] = '.';
            uVar8 = (ulong)(iVar10 + 3);
          }
          size = uVar8 & 0xffffffff;
        }
        if (((bVar1 == 0) && ((char)uVar7 == '\b')) &&
           (bVar1 = (cu->cc).len8_dlc, (byte)(bVar1 - 9) < 7)) {
          buf[lVar12] = '_';
          size = (size_t)(iVar10 + 2);
          buf[lVar12 + 1] = "0123456789ABCDEF"[bVar1];
        }
        uVar8 = (ulong)(int)size;
      }
      buf[uVar8] = '\0';
      goto LAB_00103076;
    }
  }
  memset(buf,0x2d,size - 1);
  buf[size - 1] = '\0';
LAB_00103076:
  return (int)size;
}

Assistant:

int snprintf_canframe(char *buf, size_t size, cu_t *cu, int sep)
{
	/* documentation see lib.h */

	unsigned char is_canfd = cu->fd.flags;
	int i, offset;
	int len;

	/* ensure space for string termination */
	if (size < 1)
		return size;

	/* handle CAN XL frames */
	if (cu->xl.flags & CANXL_XLF) {
		len = cu->xl.len;

		/* check if the CAN frame fits into the provided buffer */
		if (sizeof("00123#11:22:12345678#") + 2 * len + (sep ? len : 0) > size - 1) {
			/* mark buffer overflow in output */
			memset(buf, '-', size - 1);
			buf[size - 1] = 0;
			return size;
		}

		/* print prio and CAN XL header content */
		offset = sprintf(buf, "%02X%03X#%02X:%02X:%08X#",
				 (canid_t)(cu->xl.prio & CANXL_VCID_MASK) >> CANXL_VCID_OFFSET,
				 (canid_t)(cu->xl.prio & CANXL_PRIO_MASK),
				 cu->xl.flags, cu->xl.sdt, cu->xl.af);

		/* data */
		for (i = 0; i < len; i++) {
			put_hex_byte(buf + offset, cu->xl.data[i]);
			offset += 2;
			if (sep && (i + 1 < len))
				buf[offset++] = '.';
		}

		buf[offset] = 0;

		return offset;
	}

	/* handle CAN CC/FD frames - ensure max length values */
	if (is_canfd)
		len = (cu->fd.len > CANFD_MAX_DLEN) ? CANFD_MAX_DLEN : cu->fd.len;
	else
		len = (cu->fd.len > CAN_MAX_DLEN) ? CAN_MAX_DLEN : cu->fd.len;

	/* check if the CAN frame fits into the provided buffer */
	if (sizeof("12345678#_F") + 2 * len + (sep ? len : 0) +	\
	    (cu->fd.can_id & CAN_RTR_FLAG ? 2 : 0) > size - 1) {
		/* mark buffer overflow in output */
		memset(buf, '-', size - 1);
		buf[size - 1] = 0;
		return size;
	}

	if (cu->fd.can_id & CAN_ERR_FLAG) {
		put_eff_id(buf, cu->fd.can_id & (CAN_ERR_MASK | CAN_ERR_FLAG));
		buf[8] = '#';
		offset = 9;
	} else if (cu->fd.can_id & CAN_EFF_FLAG) {
		put_eff_id(buf, cu->fd.can_id & CAN_EFF_MASK);
		buf[8] = '#';
		offset = 9;
	} else {
		put_sff_id(buf, cu->fd.can_id & CAN_SFF_MASK);
		buf[3] = '#';
		offset = 4;
	}

	/* CAN CC frames may have RTR enabled. There are no ERR frames with RTR */
	if (!is_canfd && cu->fd.can_id & CAN_RTR_FLAG) {
		buf[offset++] = 'R';
		/* print a given CAN 2.0B DLC if it's not zero */
		if (len && len <= CAN_MAX_DLEN) {
			buf[offset++] = hex_asc_upper_lo(cu->fd.len);

			/* check for optional raw DLC value for CAN 2.0B frames */
			if (len == CAN_MAX_DLEN) {
				if ((cu->cc.len8_dlc > CAN_MAX_DLEN) && (cu->cc.len8_dlc <= CAN_MAX_RAW_DLC)) {
					buf[offset++] = CC_DLC_DELIM;
					buf[offset++] = hex_asc_upper_lo(cu->cc.len8_dlc);
				}
			}
		}

		buf[offset] = 0;
		return offset;
	}

	/* any CAN FD flags */
	if (is_canfd) {
		/* add CAN FD specific escape char and flags */
		buf[offset++] = '#';
		buf[offset++] = hex_asc_upper_lo(cu->fd.flags);
		if (sep && len)
			buf[offset++] = '.';
	}

	/* data */
	for (i = 0; i < len; i++) {
		put_hex_byte(buf + offset, cu->fd.data[i]);
		offset += 2;
		if (sep && (i + 1 < len))
			buf[offset++] = '.';
	}

	/* check for extra DLC when having a Classic CAN with 8 bytes payload */
	if (!is_canfd && (len == CAN_MAX_DLEN)) {
		unsigned char dlc = cu->cc.len8_dlc;

		if ((dlc > CAN_MAX_DLEN) && (dlc <= CAN_MAX_RAW_DLC)) {
			buf[offset++] = CC_DLC_DELIM;
			buf[offset++] = hex_asc_upper_lo(dlc);
		}
	}

	buf[offset] = 0;

	return offset;
}